

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O0

size_t __thiscall
capnp::expectedSizeInWordsFromPrefix(capnp *this,ArrayPtr<const_capnp::word> array)

{
  uint uVar1;
  size_t sVar2;
  WiderType<Decay<unsigned_int_&>,_Decay<unsigned_long>_> WVar3;
  uint local_4c;
  ulong uStack_48;
  uint i;
  size_t totalSize;
  ulong local_38;
  size_t offset;
  word *pwStack_28;
  uint segmentCount;
  WireValue<uint32_t> *table;
  ArrayPtr<const_capnp::word> array_local;
  
  array_local.ptr = array.ptr;
  table = (WireValue<uint32_t> *)this;
  sVar2 = kj::ArrayPtr<const_capnp::word>::size((ArrayPtr<const_capnp::word> *)&table);
  if (sVar2 == 0) {
    array_local.size_ = 1;
  }
  else {
    pwStack_28 = kj::ArrayPtr<const_capnp::word>::begin((ArrayPtr<const_capnp::word> *)&table);
    uVar1 = _::DirectWireValue<unsigned_int>::get((DirectWireValue<unsigned_int> *)pwStack_28);
    offset._4_4_ = uVar1 + 1;
    local_38 = (ulong)((offset._4_4_ >> 1) + 1);
    sVar2 = kj::ArrayPtr<const_capnp::word>::size((ArrayPtr<const_capnp::word> *)&table);
    totalSize = sVar2 * 2 - 1;
    WVar3 = kj::min<unsigned_int&,unsigned_long>((uint *)((long)&offset + 4),&totalSize);
    offset._4_4_ = (uint)WVar3;
    uStack_48 = local_38;
    for (local_4c = 0; local_4c < offset._4_4_; local_4c = local_4c + 1) {
      uVar1 = _::DirectWireValue<unsigned_int>::get
                        ((DirectWireValue<unsigned_int> *)
                         ((long)&pwStack_28->content + (ulong)(local_4c + 1) * 4));
      uStack_48 = uVar1 + uStack_48;
    }
    array_local.size_ = uStack_48;
  }
  return array_local.size_;
}

Assistant:

size_t expectedSizeInWordsFromPrefix(kj::ArrayPtr<const word> array) {
  if (array.size() < 1) {
    // All messages are at least one word.
    return 1;
  }

  const _::WireValue<uint32_t>* table =
      reinterpret_cast<const _::WireValue<uint32_t>*>(array.begin());

  uint segmentCount = table[0].get() + 1;
  size_t offset = segmentCount / 2u + 1u;

  // If the array is too small to contain the full segment table, truncate segmentCount to just
  // what is available.
  segmentCount = kj::min(segmentCount, array.size() * 2 - 1u);

  size_t totalSize = offset;
  for (uint i = 0; i < segmentCount; i++) {
    totalSize += table[i + 1].get();
  }
  return totalSize;
}